

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  cmGeneratorTarget *pcVar1;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *this_01;
  bool bVar2;
  TargetType targetType;
  cmGlobalNinjaGenerator *pcVar3;
  string *psVar4;
  char **ppcVar5;
  string *linkCmd;
  string launcher;
  string responseFlag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string val;
  string linker;
  cmNinjaRule rule;
  char local_3c2 [2];
  string *local_3c0;
  cmRulePlaceholderExpander *local_3b8;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  char *local_318;
  string local_310;
  string local_2f0;
  RuleVariables local_2d0;
  undefined1 local_178 [64];
  string local_138 [32];
  string local_118 [96];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [40];
  string local_50;
  
  local_3c0 = config;
  LanguageLinkerDeviceRule(&local_50,this,config);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_178,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar3,(string *)local_178);
  if (!bVar2) {
    memset(&local_2d0,0,0x158);
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    local_2d0.CMTargetName = (psVar4->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType
                           ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                            GeneratorTarget);
    psVar4 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_2d0.CMTargetType = (psVar4->_M_dataplus)._M_p;
    local_2d0.Language = "CUDA";
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"CUDA",(allocator<char> *)&local_390);
    cmGeneratorTarget::GetLinkerTool(&local_2f0,pcVar1,&local_350,local_3c0);
    std::__cxx11::string::~string((string *)&local_350);
    local_2d0.Linker = local_2f0._M_dataplus._M_p;
    this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG",
               (allocator<char> *)&local_310);
    psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_390);
    std::__cxx11::string::string((string *)&local_350,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_390);
    if ((useResponseFile) && (local_350._M_string_length != 0)) {
      std::__cxx11::string::assign(local_b8);
      std::__cxx11::string::append((string *)&local_350);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign(local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"CUDA",(allocator<char> *)&local_310);
      bVar2 = CheckUseResponseFileForLibraries(this,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      if (bVar2) {
        std::__cxx11::string::append(local_98);
        local_2d0.LinkLibraries = "";
      }
      else {
        local_2d0.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }
      ppcVar5 = &local_2d0.Objects;
    }
    else {
      ppcVar5 = &local_2d0.LinkLibraries;
      local_2d0.Objects = "$in";
      local_350._M_dataplus._M_p = "$LINK_PATH $LINK_LIBRARIES";
    }
    *ppcVar5 = local_350._M_dataplus._M_p;
    local_2d0.ObjectDir = "$OBJECT_DIR";
    local_2d0.Target = "$TARGET_FILE";
    local_2d0.SONameFlag = "$SONAME_FLAG";
    local_2d0.TargetSOName = "$SONAME";
    local_2d0.TargetPDB = "$TARGET_PDB";
    local_2d0.TargetCompilePDB = "$TARGET_COMPILE_PDB";
    local_2d0.Flags = "$FLAGS";
    local_2d0.LinkFlags = "$LINK_FLAGS";
    local_2d0.Manifests = "$MANIFESTS";
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    local_390._M_string_length = 0;
    local_2d0.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";
    local_390.field_2._M_local_buf[0] = '\0';
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"RULE_LAUNCH_LINK",(allocator<char> *)&local_3b0);
    cmLocalGenerator::GetRuleLauncher
              (&local_310,(cmLocalGenerator *)this_01,pcVar1,&local_370,local_3c0);
    std::__cxx11::string::~string((string *)&local_370);
    if (local_310._M_string_length != 0) {
      local_3b0._M_dataplus._M_p._0_1_ = 0x20;
      cmStrCat<std::__cxx11::string&,char>(&local_370,&local_310,(char *)&local_3b0);
      std::__cxx11::string::operator=((string *)&local_390,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
    }
    (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
      super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_3b8);
    ComputeDeviceLinkCmd_abi_cxx11_(&local_330,this);
    for (; local_330.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_330.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_330.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_330.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                (&local_370,&local_390,
                 local_330.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::operator=
                ((string *)
                 local_330.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_3b8,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 local_330.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&local_2d0);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&local_330);
    psVar4 = local_3c0;
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    local_3b0._M_string_length = 0;
    local_3b0.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_370,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_330,local_3c0,
               local_3c0,&local_3b0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)(local_178 + 0x20),(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3b0);
    TargetLinkLanguage(&local_3b0,this,psVar4);
    local_3c2[0] = ' ';
    local_318 = GetVisibleTypeName(this);
    local_3c2[1] = 0x2e;
    cmStrCat<char_const(&)[18],std::__cxx11::string,char,char_const*,char>
              (&local_370,(char (*) [18])"Rule for linking ",&local_3b0,local_3c2,&local_318,
               local_3c2 + 1);
    std::__cxx11::string::operator=(local_118,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3b0);
    TargetLinkLanguage(&local_3b0,this,local_3c0);
    local_3c2[0] = ' ';
    local_318 = GetVisibleTypeName(this);
    cmStrCat<char_const(&)[9],std::__cxx11::string,char,char_const*,char_const(&)[14]>
              (&local_370,(char (*) [9])"Linking ",&local_3b0,local_3c2,&local_318,
               (char (*) [14])0x7502fa);
    std::__cxx11::string::operator=(local_138,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::assign(local_78);
    pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_330);
    if (local_3b8 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_3b8->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_178);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule(
  bool useResponseFile, const std::string& config)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule(config));
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
        .c_str();

    vars.Language = "CUDA";
    std::string linker =
      this->GetGeneratorTarget()->GetLinkerTool("CUDA", config);
    vars.Linker = linker.c_str();

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // add the link command in the file if necessary
      if (this->CheckUseResponseFileForLibraries("CUDA")) {
        rule.RspContent += " $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      vars.Objects = responseFlag.c_str();
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    vars.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}